

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSpeedup.c
# Opt level: O0

int Gia_ManSpeedupObj_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vNodes)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  Vec_Int_t *vNodes_local;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjIsTravIdCurrent(p,pObj);
  if (iVar1 == 0) {
    Gia_ObjSetTravIdCurrent(p,pObj);
    iVar1 = Gia_ObjIsCi(pObj);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsAnd(pObj);
      if (iVar1 == 0) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSpeedup.c"
                      ,0x228,"int Gia_ManSpeedupObj_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
      }
      pGVar2 = Gia_ObjFanin0(pObj);
      iVar1 = Gia_ManSpeedupObj_rec(p,pGVar2,vNodes);
      if (iVar1 == 0) {
        p_local._4_4_ = 0;
      }
      else {
        pGVar2 = Gia_ObjFanin1(pObj);
        iVar1 = Gia_ManSpeedupObj_rec(p,pGVar2,vNodes);
        if (iVar1 == 0) {
          p_local._4_4_ = 0;
        }
        else {
          iVar1 = Gia_ObjId(p,pObj);
          Vec_IntPush(vNodes,iVar1);
          p_local._4_4_ = 1;
        }
      }
    }
    else {
      p_local._4_4_ = 0;
    }
  }
  else {
    p_local._4_4_ = 1;
  }
  return p_local._4_4_;
}

Assistant:

int Gia_ManSpeedupObj_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vNodes )
{
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return 1;
    Gia_ObjSetTravIdCurrent( p, pObj );
    if ( Gia_ObjIsCi(pObj) )
        return 0;
    assert( Gia_ObjIsAnd(pObj) );
    if ( !Gia_ManSpeedupObj_rec( p, Gia_ObjFanin0(pObj), vNodes ) )
        return 0;
    if ( !Gia_ManSpeedupObj_rec( p, Gia_ObjFanin1(pObj), vNodes ) )
        return 0;
    Vec_IntPush( vNodes, Gia_ObjId(p, pObj) );
    return 1;
}